

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O1

void __thiscall
dgMatrix::TransformTriplex
          (dgMatrix *this,HaF64 *dst,HaI32 dstStrideInBytes,HaF32 *src,HaI32 srcStrideInBytes,
          HaI32 count)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  HaF32 *pHVar7;
  double *pdVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined8 in_XMM0_Qa;
  undefined1 auVar13 [16];
  undefined8 in_XMM2_Qa;
  undefined1 auVar14 [16];
  undefined8 in_XMM4_Qa;
  undefined1 auVar15 [16];
  undefined8 in_XMM6_Qa;
  undefined1 auVar16 [16];
  undefined8 in_XMM8_Qa;
  undefined1 auVar17 [16];
  undefined8 in_XMM10_Qa;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM16 [16];
  undefined1 auVar11 [16];
  
  if (0 < count) {
    auVar13._0_8_ = (double)(this->m_front).super_dgTemplateVector<float>.m_x;
    auVar13._8_8_ = in_XMM0_Qa;
    fVar1 = (this->m_up).super_dgTemplateVector<float>.m_x;
    auVar14._0_8_ = (double)(this->m_right).super_dgTemplateVector<float>.m_x;
    auVar14._8_8_ = in_XMM2_Qa;
    fVar2 = (this->m_posit).super_dgTemplateVector<float>.m_x;
    auVar15._0_8_ = (double)(this->m_front).super_dgTemplateVector<float>.m_y;
    auVar15._8_8_ = in_XMM4_Qa;
    fVar3 = (this->m_up).super_dgTemplateVector<float>.m_y;
    auVar16._0_8_ = (double)(this->m_right).super_dgTemplateVector<float>.m_y;
    auVar16._8_8_ = in_XMM6_Qa;
    fVar4 = (this->m_posit).super_dgTemplateVector<float>.m_y;
    auVar17._0_8_ = (double)(this->m_front).super_dgTemplateVector<float>.m_z;
    auVar17._8_8_ = in_XMM8_Qa;
    fVar5 = (this->m_up).super_dgTemplateVector<float>.m_z;
    auVar18._0_8_ = (double)(this->m_right).super_dgTemplateVector<float>.m_z;
    auVar18._8_8_ = in_XMM10_Qa;
    fVar6 = (this->m_posit).super_dgTemplateVector<float>.m_z;
    pHVar7 = src + 2;
    pdVar8 = (double *)(dst + 2);
    do {
      auVar10 = vcvtss2sd_avx512f(in_XMM16,ZEXT416((uint)pHVar7[-2]));
      auVar11 = vcvtss2sd_avx512f(in_XMM16,ZEXT416((uint)pHVar7[-1]));
      dVar9 = auVar11._0_8_;
      auVar12 = vcvtss2sd_avx512f(in_XMM16,ZEXT416((uint)*pHVar7));
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar9 * (double)fVar1;
      auVar11 = vfmadd231sd_fma(auVar19,auVar10,auVar13);
      auVar11 = vfmadd231sd_fma(auVar11,auVar12,auVar14);
      pdVar8[-2] = auVar11._0_8_ + (double)fVar2;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar9 * (double)fVar3;
      auVar11 = vfmadd231sd_fma(auVar20,auVar10,auVar15);
      auVar11 = vfmadd231sd_fma(auVar11,auVar12,auVar16);
      pdVar8[-1] = auVar11._0_8_ + (double)fVar4;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar9 * (double)fVar5;
      auVar11 = vfmadd231sd_fma(auVar11,auVar17,auVar10);
      auVar11 = vfmadd231sd_fma(auVar11,auVar18,auVar12);
      *pdVar8 = auVar11._0_8_ + (double)fVar6;
      pHVar7 = pHVar7 + (srcStrideInBytes >> 2);
      pdVar8 = pdVar8 + (dstStrideInBytes >> 3);
      count = count + -1;
    } while (count != 0);
  }
  return;
}

Assistant:

void dgMatrix::TransformTriplex (hacd::HaF64* const dst, hacd::HaI32 dstStrideInBytes, const hacd::HaF32* const src, hacd::HaI32 srcStrideInBytes, hacd::HaI32 count) const
{
	hacd::HaI32 dstStride = dstStrideInBytes /sizeof (hacd::HaF64);
	hacd::HaI32 srcStride = srcStrideInBytes / sizeof (hacd::HaF32);

	hacd::HaI32 dstIndex = 0;
	hacd::HaI32 srcIndex = 0;
	for (hacd::HaI32 i = 0 ; i < count; i ++ ) {
		hacd::HaF64 x = src[srcIndex + 0];
		hacd::HaF64 y = src[srcIndex + 1];
		hacd::HaF64 z = src[srcIndex + 2];
		srcIndex += srcStride;
		dst[dstIndex + 0] = x * m_front.m_x + y * m_up.m_x + z * m_right.m_x + m_posit.m_x;
		dst[dstIndex + 1] = x * m_front.m_y + y * m_up.m_y + z * m_right.m_y + m_posit.m_y;
		dst[dstIndex + 2] = x * m_front.m_z + y * m_up.m_z + z * m_right.m_z + m_posit.m_z;
		dstIndex += dstStride;
	}
}